

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunction * duckdb::AsinhFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  scalar_function_t *unaff_retaddr;
  LogicalType *in_stack_00000008;
  vector<duckdb::LogicalType,_true> *in_stack_00000010;
  ScalarFunction *in_stack_00000018;
  function_statistics_t in_stack_00000050;
  init_local_state_t in_stack_00000058;
  LogicalType *in_stack_00000060;
  FunctionStability in_stack_00000068;
  FunctionNullHandling in_stack_00000070;
  bind_lambda_function_t in_stack_00000078;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  LogicalTypeId in_stack_fffffffffffffeef;
  LogicalType *in_stack_fffffffffffffef0;
  undefined1 **local_d0;
  undefined1 *local_48 [3];
  undefined8 *local_30;
  undefined8 local_28;
  bind_scalar_function_extended_t in_stack_fffffffffffffff0;
  ScalarFunction *bind;
  
  bind = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
  local_30 = local_48;
  local_28 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x207b8b9);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffee0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffed8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffee4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  LogicalType::LogicalType(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  LogicalType::LogicalType(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
  ScalarFunction::ScalarFunction
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (bind_scalar_function_t)bind,in_stack_fffffffffffffff0,in_stack_00000050,
             in_stack_00000058,in_stack_00000060,in_stack_00000068,in_stack_00000070,
             in_stack_00000078);
  LogicalType::~LogicalType((LogicalType *)0x207b983);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x207b990);
  LogicalType::~LogicalType((LogicalType *)0x207b99d);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x207b9aa);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x207b9b7);
  local_d0 = (undefined1 **)&local_30;
  do {
    local_d0 = local_d0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x207b9e0);
  } while (local_d0 != local_48);
  return in_RDI;
}

Assistant:

ScalarFunction AsinhFun::GetFunction() {
	return ScalarFunction({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                      ScalarFunction::UnaryFunction<double, double, AsinhOperator>);
}